

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::register_custom_layer(Net *this,int index,layer_creator_func creator)

{
  vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_> *this_00;
  int iVar1;
  pointer plVar2;
  uint uVar3;
  layer_registry_entry dummy;
  
  uVar3 = index & 0xfffffeff;
  if (uVar3 == index) {
    fprintf(_stderr,"can not register build-in layer index %d\n",index);
    iVar1 = -1;
  }
  else {
    this_00 = &this->custom_layer_registry;
    plVar2 = (this->custom_layer_registry).
             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->custom_layer_registry).
                            super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)plVar2) >> 4) <=
        (int)uVar3) {
      dummy.name = "";
      dummy.creator = (layer_creator_func)0x0;
      std::vector<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>::resize
                (this_00,(long)(int)(uVar3 + 1),&dummy);
      plVar2 = (this_00->
               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    if (plVar2[(int)uVar3].creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d\n",(ulong)uVar3);
      plVar2 = (this_00->
               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
    plVar2[(int)uVar3].creator = creator;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        fprintf(stderr, "can not register build-in layer index %d\n", custom_index);
        return -1;
    }

    if ((int)custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct layer_registry_entry dummy = { "", 0 };
#else
        struct layer_registry_entry dummy = { 0 };
#endif // NCNN_STRING
        custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (custom_layer_registry[custom_index].creator)
    {
        fprintf(stderr, "overwrite existing custom layer index %d\n", custom_index);
    }

    custom_layer_registry[custom_index].creator = creator;
    return 0;
}